

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O0

char * ODDLParser::OpenDDLParser::parseFloatingLiteral
                 (char *in,char *end,Value **floating,ValueType floatType)

{
  bool bVar1;
  char *in_00;
  Value *pVVar2;
  double dVar3;
  float value_1;
  double value;
  bool ok;
  char *start;
  ValueType floatType_local;
  Value **floating_local;
  char *end_local;
  char *in_local;
  
  *floating = (Value *)0x0;
  in_local = in;
  if ((in != (char *)0x0) && (in != end)) {
    in_00 = lookForNextToken<char>(in,end);
    for (end_local = in_00; bVar1 = isSeparator<char>(*end_local), !bVar1 && end_local != end;
        end_local = end_local + 1) {
    }
    value._7_1_ = false;
    bVar1 = isHexLiteral<char>(in_00,end);
    if (bVar1) {
      parseHexaLiteral(in_00,end,floating);
      in_local = end_local;
    }
    else {
      bVar1 = isNumeric<char>(*in_00);
      if (bVar1) {
        value._7_1_ = true;
      }
      else if (*in_00 == '-') {
        value._7_1_ = isNumeric<char>(in_00[1]);
      }
      if (value._7_1_ != false) {
        if (floatType == ddl_double) {
          dVar3 = atof(in_00);
          pVVar2 = ValueAllocator::allocPrimData(ddl_double,1);
          *floating = pVVar2;
          Value::setDouble(*floating,dVar3);
        }
        else {
          dVar3 = atof(in_00);
          pVVar2 = ValueAllocator::allocPrimData(ddl_float,1);
          *floating = pVVar2;
          Value::setFloat(*floating,(float)dVar3);
        }
      }
      in_local = end_local;
    }
  }
  return in_local;
}

Assistant:

char *OpenDDLParser::parseFloatingLiteral( char *in, char *end, Value **floating, Value::ValueType floatType) {
    *floating = ddl_nullptr;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    in = lookForNextToken( in, end );
    char *start( in );
    while( !isSeparator( *in ) && in != end ) {
        ++in;
    }

    // parse the float value
    bool ok( false );
    if ( isHexLiteral( start, end ) ) {
        parseHexaLiteral( start, end, floating );
        return in;
    }

    if( isNumeric( *start ) ) {
        ok = true;
    } else {
        if( *start == '-' ) {
            if( isNumeric( *(start+1) ) ) {
                ok = true;
            }
        }
    }

    if( ok ) {
        if ( floatType == Value::ddl_double ) {
            const double value( atof( start ) );
            *floating = ValueAllocator::allocPrimData( Value::ddl_double );
            ( *floating )->setDouble( value );
        } else {
            const float value( ( float ) atof( start ) );
            *floating = ValueAllocator::allocPrimData( Value::ddl_float );
            ( *floating )->setFloat( value );
        }
    }

    return in;
}